

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

int Nwk_ManMinimumBaseInt(Nwk_Man_t *pNtk,int fVerbose)

{
  Nwk_Obj_t *pObj;
  int iVar1;
  Vec_Int_t *vTruth;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  long lVar5;
  
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar2 = (int *)malloc(0x40000);
  vTruth->pArray = piVar2;
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar3->pArray[lVar5];
      if ((pObj != (Nwk_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x20 & 7) == 3)) {
        iVar1 = Nwk_ManMinimumBaseNode(pObj,vTruth,fVerbose);
        uVar4 = uVar4 + iVar1;
        pVVar3 = pNtk->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar3->nSize);
    if ((fVerbose != 0) && (uVar4 != 0)) {
      printf("Support minimization reduced support of %d nodes.\n",(ulong)uVar4);
    }
  }
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
  }
  free(vTruth);
  return uVar4;
}

Assistant:

int Nwk_ManMinimumBaseInt( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, Counter = 0;
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
        Counter += Nwk_ManMinimumBaseNode( pObj, vTruth, fVerbose );
    if ( fVerbose && Counter )
        printf( "Support minimization reduced support of %d nodes.\n", Counter );
    Vec_IntFree( vTruth );
    return Counter;
}